

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BarrierCase::init(BarrierCase *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  bool bVar2;
  int iVar3;
  RenderTarget *renderTarget;
  ShaderProgram *pSVar4;
  RenderContext *renderCtx;
  Context *pCVar5;
  ProgramSources *pPVar6;
  TestLog *log;
  TestError *this_00;
  char *in_RCX;
  string local_430;
  ShaderSource local_410;
  string local_3e8;
  ShaderSource local_3c8;
  string local_3a0;
  ShaderSource local_380;
  string local_358;
  ShaderSource local_338;
  ProgramSources local_310;
  SharedPtr<const_glu::ShaderProgram> local_240;
  allocator<char> local_229;
  string local_228 [8];
  string fragmentShaderTemplate;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined1 local_148 [8];
  string tessellationEvaluationTemplate;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  string tessellationControlTemplate;
  allocator<char> local_51;
  string local_50 [8];
  string vertexShaderTemplate;
  string numVertsStr;
  BarrierCase *this_local;
  
  checkTessellationSupport((this->super_TestCase).m_context);
  renderTarget = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize(renderTarget,0x100);
  de::toString<int>((string *)((long)&vertexShaderTemplate.field_2 + 8),
                    &(anonymous_namespace)::BarrierCase::NUM_VERTICES);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,
             "${GLSL_VERSION_DECL}\n\nin highp float in_v_attr;\n\nout highp float in_tc_attr;\n\nvoid main (void)\n{\n\tin_tc_attr = in_v_attr;\n}\n"
             ,&local_51);
  std::allocator<char>::~allocator(&local_51);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&tessellationEvaluationTemplate.field_2 + 8),
                 "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&vertexShaderTemplate.field_2 + 8));
  std::operator+(&local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&tessellationEvaluationTemplate.field_2 + 8),
                 ") out;\n\nin highp float in_tc_attr[];\n\nout highp float in_te_attr[];\npatch out highp float in_te_patchAttr;\n\nvoid main (void)\n{\n\tin_te_attr[gl_InvocationID] = in_tc_attr[gl_InvocationID];\n\tin_te_patchAttr = 0.0f;\n\tbarrier();\n\tif (gl_InvocationID == 5)\n\t\tin_te_patchAttr = float(gl_InvocationID)*0.1;\n\tbarrier();\n\thighp float temp = in_te_patchAttr + in_te_attr[gl_InvocationID];\n\tbarrier();\n\tif (gl_InvocationID == "
                );
  std::operator+(&local_e8,&local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&vertexShaderTemplate.field_2 + 8));
  std::operator+(&local_c8,&local_e8,
                 "-1)\n\t\tin_te_patchAttr = float(gl_InvocationID);\n\tbarrier();\n\tin_te_attr[gl_InvocationID] = temp;\n\tbarrier();\n\ttemp = temp + in_te_attr[(gl_InvocationID+1) % "
                );
  std::operator+(&local_a8,&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&vertexShaderTemplate.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 &local_a8,
                 "];\n\tbarrier();\n\tin_te_attr[gl_InvocationID] = 0.25*temp;\n\n\tgl_TessLevelInner[0] = 32.0;\n\tgl_TessLevelInner[1] = 32.0;\n\n\tgl_TessLevelOuter[0] = 32.0;\n\tgl_TessLevelOuter[1] = 32.0;\n\tgl_TessLevelOuter[2] = 32.0;\n\tgl_TessLevelOuter[3] = 32.0;\n}\n"
                );
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)(tessellationEvaluationTemplate.field_2._M_local_buf + 8))
  ;
  (anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            ((string *)((long)&fragmentShaderTemplate.field_2 + 8),
             (_anonymous_namespace_ *)&DAT_00000001,TESSPRIMITIVETYPE_TRIANGLES,SUB81(in_RCX,0));
  std::operator+(&local_1e8,"${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&fragmentShaderTemplate.field_2 + 8));
  std::operator+(&local_1c8,&local_1e8,
                 "\nin highp float in_te_attr[];\npatch in highp float in_te_patchAttr;\n\nout highp float in_f_blue;\n\nvoid main (void)\n{\n\thighp float x = gl_TessCoord.x*2.0 - 1.0;\n\thighp float y = gl_TessCoord.y - in_te_attr[int(round(gl_TessCoord.x*float("
                );
  std::operator+(&local_1a8,&local_1c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&vertexShaderTemplate.field_2 + 8));
  std::operator+(&local_188,&local_1a8,
                 "-1)))];\n\tgl_Position = vec4(x, y, 0.0, 1.0);\n\tin_f_blue = abs(in_te_patchAttr - float("
                );
  std::operator+(&local_168,&local_188,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&vertexShaderTemplate.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                 &local_168,"-1));\n}\n");
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)(fragmentShaderTemplate.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_228,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin highp float in_f_blue;\n\nvoid main (void)\n{\n\to_color = vec4(1.0, 0.0, in_f_blue, 1.0);\n}\n"
             ,&local_229);
  std::allocator<char>::~allocator(&local_229);
  pSVar4 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_310);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar5 = (Context *)std::__cxx11::string::c_str();
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_358,(_anonymous_namespace_ *)pCVar1,pCVar5,in_RCX);
  glu::VertexSource::VertexSource((VertexSource *)&local_338,&local_358);
  pPVar6 = glu::ProgramSources::operator<<(&local_310,&local_338);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar5 = (Context *)std::__cxx11::string::c_str();
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_3a0,(_anonymous_namespace_ *)pCVar1,pCVar5,in_RCX);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)&local_380,&local_3a0);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_380);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar5 = (Context *)std::__cxx11::string::c_str();
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_3e8,(_anonymous_namespace_ *)pCVar1,pCVar5,in_RCX);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_3c8,&local_3e8);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_3c8);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar5 = (Context *)std::__cxx11::string::c_str();
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_430,(_anonymous_namespace_ *)pCVar1,pCVar5,in_RCX);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_410,&local_430);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_410);
  glu::ShaderProgram::ShaderProgram(pSVar4,renderCtx,pPVar6);
  de::SharedPtr<const_glu::ShaderProgram>::SharedPtr(&local_240,pSVar4);
  de::SharedPtr<const_glu::ShaderProgram>::operator=(&this->m_program,&local_240);
  de::SharedPtr<const_glu::ShaderProgram>::~SharedPtr(&local_240);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_410);
  std::__cxx11::string::~string((string *)&local_430);
  glu::TessellationEvaluationSource::~TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3e8);
  glu::TessellationControlSource::~TessellationControlSource
            ((TessellationControlSource *)&local_380);
  std::__cxx11::string::~string((string *)&local_3a0);
  glu::VertexSource::~VertexSource((VertexSource *)&local_338);
  std::__cxx11::string::~string((string *)&local_358);
  glu::ProgramSources::~ProgramSources(&local_310);
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pSVar4 = de::SharedPtr<const_glu::ShaderProgram>::operator*(&this->m_program);
  glu::operator<<(log,pSVar4);
  pSVar4 = de::SharedPtr<const_glu::ShaderProgram>::operator->(&this->m_program);
  bVar2 = glu::ShaderProgram::isOk(pSVar4);
  if (!bVar2) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Program compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
               ,0xd7b);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::__cxx11::string::~string(local_228);
  std::__cxx11::string::~string((string *)local_148);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string(local_50);
  iVar3 = std::__cxx11::string::~string((string *)(vertexShaderTemplate.field_2._M_local_buf + 8));
  return iVar3;
}

Assistant:

void BarrierCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	const string numVertsStr = de::toString(NUM_VERTICES);

	std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "in highp float in_v_attr;\n"
													 "\n"
													 "out highp float in_tc_attr;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	in_tc_attr = in_v_attr;\n"
												 "}\n");
	std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
													 "\n"
													 "layout (vertices = " + numVertsStr + ") out;\n"
													 "\n"
													 "in highp float in_tc_attr[];\n"
													 "\n"
													 "out highp float in_te_attr[];\n"
													 "patch out highp float in_te_patchAttr;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	in_te_attr[gl_InvocationID] = in_tc_attr[gl_InvocationID];\n"
													 "	in_te_patchAttr = 0.0f;\n"
													 "	barrier();\n"
													 "	if (gl_InvocationID == 5)\n"
													 "		in_te_patchAttr = float(gl_InvocationID)*0.1;\n"
													 "	barrier();\n"
													 "	highp float temp = in_te_patchAttr + in_te_attr[gl_InvocationID];\n"
													 "	barrier();\n"
													 "	if (gl_InvocationID == " + numVertsStr + "-1)\n"
													 "		in_te_patchAttr = float(gl_InvocationID);\n"
													 "	barrier();\n"
													 "	in_te_attr[gl_InvocationID] = temp;\n"
													 "	barrier();\n"
													 "	temp = temp + in_te_attr[(gl_InvocationID+1) % " + numVertsStr + "];\n"
													 "	barrier();\n"
													 "	in_te_attr[gl_InvocationID] = 0.25*temp;\n"
													 "\n"
													 "	gl_TessLevelInner[0] = 32.0;\n"
													 "	gl_TessLevelInner[1] = 32.0;\n"
													 "\n"
													 "	gl_TessLevelOuter[0] = 32.0;\n"
													 "	gl_TessLevelOuter[1] = 32.0;\n"
													 "	gl_TessLevelOuter[2] = 32.0;\n"
													 "	gl_TessLevelOuter[3] = 32.0;\n"
												 "}\n");
	std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
													 "\n"
													 + getTessellationEvaluationInLayoutString(TESSPRIMITIVETYPE_QUADS) +
													 "\n"
													 "in highp float in_te_attr[];\n"
													 "patch in highp float in_te_patchAttr;\n"
													 "\n"
													 "out highp float in_f_blue;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	highp float x = gl_TessCoord.x*2.0 - 1.0;\n"
													 "	highp float y = gl_TessCoord.y - in_te_attr[int(round(gl_TessCoord.x*float(" + numVertsStr + "-1)))];\n"
													 "	gl_Position = vec4(x, y, 0.0, 1.0);\n"
													 "	in_f_blue = abs(in_te_patchAttr - float(" + numVertsStr + "-1));\n"
												 "}\n");
	std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "layout (location = 0) out mediump vec4 o_color;\n"
													 "\n"
													 "in highp float in_f_blue;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	o_color = vec4(1.0, 0.0, in_f_blue, 1.0);\n"
												 "}\n");

	m_program = SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
			<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
			<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
			<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))));

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}